

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdatabase.cpp
# Opt level: O1

QtFontStyle * bestStyle(QtFontFoundry *foundry,Key *styleKey,QString *styleName)

{
  ushort uVar1;
  int iVar2;
  QtFontStyle **ppQVar3;
  char16_t *pcVar4;
  long lVar5;
  QtFontStyle *pQVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  uint3 uVar10;
  uint3 uVar11;
  char cVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  long in_FS_OFFSET;
  bool bVar19;
  QStringView QVar20;
  QStringView QVar21;
  char local_58 [24];
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = foundry->count;
  uVar18 = 0;
  if ((long)iVar2 < 1) {
    uVar15 = 0xffff;
  }
  else {
    ppQVar3 = foundry->styles;
    pcVar4 = (styleName->d).ptr;
    lVar5 = (styleName->d).size;
    uVar1 = *(ushort *)styleKey;
    uVar10 = *(uint3 *)styleKey;
    uVar15 = 0xffff;
    uVar17 = 0;
    do {
      pQVar6 = ppQVar3[uVar17];
      if (((lVar5 == 0) || (lVar7 = (pQVar6->styleName).d.size, lVar5 != lVar7)) ||
         (QVar20.m_data = pcVar4, QVar20.m_size = lVar5, QVar21.m_data = (pQVar6->styleName).d.ptr,
         QVar21.m_size = lVar7, cVar12 = QtPrivate::equalStrings(QVar20,QVar21), cVar12 == '\0')) {
        uVar11 = *(uint3 *)&pQVar6->key;
        uVar8 = (int)((uVar1 >> 2 & 0x3ff) - (*(ushort *)&pQVar6->key >> 2 & 0x3ff)) / 10;
        uVar13 = -uVar8;
        if (0 < (int)uVar8) {
          uVar13 = uVar8;
        }
        if ((0xfff < uVar10) && (0xfff < uVar11)) {
          iVar16 = ((int)((uint)uVar10 << 8) >> 0x14) - ((int)((uint)uVar11 << 8) >> 0x14);
          iVar14 = -iVar16;
          if (0 < iVar16) {
            iVar14 = iVar16;
          }
          uVar13 = uVar13 + iVar14;
        }
        if ((uVar10 & 3) != (uVar11 & 3)) {
          if (((uVar10 & 3) == 0) || ((uVar11 & 3) == 0)) {
            uVar13 = uVar13 + 0x1000;
          }
          else {
            uVar13 = uVar13 + 1;
          }
        }
        uVar9 = uVar18;
        if ((int)uVar13 < (int)uVar15) {
          uVar9 = uVar17;
          uVar15 = uVar13;
        }
        bVar19 = false;
      }
      else {
        bVar19 = true;
        uVar15 = 0;
        uVar9 = uVar17;
      }
      uVar18 = uVar9 & 0xffffffff;
    } while ((!bVar19) && (bVar19 = (long)iVar2 - 1U != uVar17, uVar17 = uVar17 + 1, bVar19));
    uVar18 = (ulong)(int)uVar9;
  }
  QtPrivateLogging::lcFontMatch();
  if (((byte)QtPrivateLogging::lcFontMatch::category.field_2.bools.enabledDebug._q_value._M_base.
             _M_i & 1) != 0) {
    local_58[0] = '\x02';
    local_58[1] = '\0';
    local_58[2] = '\0';
    local_58[3] = '\0';
    local_58[4] = '\0';
    local_58[5] = '\0';
    local_58[6] = '\0';
    local_58[7] = '\0';
    local_58[8] = '\0';
    local_58[9] = '\0';
    local_58[10] = '\0';
    local_58[0xb] = '\0';
    local_58[0xc] = '\0';
    local_58[0xd] = '\0';
    local_58[0xe] = '\0';
    local_58[0xf] = '\0';
    local_58[0x10] = '\0';
    local_58[0x11] = '\0';
    local_58[0x12] = '\0';
    local_58[0x13] = '\0';
    local_58[0x14] = '\0';
    local_58[0x15] = '\0';
    local_58[0x16] = '\0';
    local_58[0x17] = '\0';
    local_40 = QtPrivateLogging::lcFontMatch::category.name;
    QMessageLogger::debug(local_58,"          best style has distance 0x%x",(ulong)uVar15);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return foundry->styles[uVar18];
}

Assistant:

static QtFontStyle *bestStyle(QtFontFoundry *foundry, const QtFontStyle::Key &styleKey,
                              const QString &styleName = QString())
{
    int best = 0;
    int dist = 0xffff;

    for ( int i = 0; i < foundry->count; i++ ) {
        QtFontStyle *style = foundry->styles[i];

        if (!styleName.isEmpty() && styleName == style->styleName) {
            dist = 0;
            best = i;
            break;
        }

        int d = qAbs( (int(styleKey.weight) - int(style->key.weight)) / 10 );

        if ( styleKey.stretch != 0 && style->key.stretch != 0 ) {
            d += qAbs( styleKey.stretch - style->key.stretch );
        }

        if (styleKey.style != style->key.style) {
            if (styleKey.style != QFont::StyleNormal && style->key.style != QFont::StyleNormal)
                // one is italic, the other oblique
                d += 0x0001;
            else
                d += 0x1000;
        }

        if ( d < dist ) {
            best = i;
            dist = d;
        }
    }

    qCDebug(lcFontMatch,  "          best style has distance 0x%x", dist );
    return foundry->styles[best];
}